

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O0

int __thiscall
ON_Matrix::RowReduce(ON_Matrix *this,double zero_tolerance,ON_3dPoint *B,double *pivot)

{
  ON_3dPoint *pOVar1;
  ON_3dPoint *pOVar2;
  int local_ac;
  ON_3dPoint local_a0;
  ON_3dVector local_88;
  int local_6c;
  double **ppdStack_68;
  int n;
  double **this_m;
  int rank;
  int ix;
  int k;
  int i;
  double piv;
  double x;
  ON_3dPoint t;
  double *pivot_local;
  ON_3dPoint *B_local;
  double zero_tolerance_local;
  ON_Matrix *this_local;
  
  t.z = (double)pivot;
  ppdStack_68 = ThisM(this);
  _k = 0.0;
  this_m._0_4_ = 0;
  if (this->m_col_count < this->m_row_count) {
    local_ac = this->m_col_count;
  }
  else {
    local_ac = this->m_row_count;
  }
  local_6c = local_ac;
  for (rank = 0; rank < local_6c; rank = rank + 1) {
    onmalloc(0);
    this_m._4_4_ = rank;
    piv = ABS(ppdStack_68[rank][rank]);
    ix = rank;
    while (ix = ix + 1, ix < this->m_row_count) {
      if (piv < ABS(ppdStack_68[ix][rank])) {
        this_m._4_4_ = ix;
        piv = ABS(ppdStack_68[ix][rank]);
      }
    }
    if ((piv < _k) || (rank == 0)) {
      _k = piv;
    }
    if (piv <= zero_tolerance) break;
    this_m._0_4_ = (int)this_m + 1;
    if (this_m._4_4_ != rank) {
      SwapRows(this,this_m._4_4_,rank);
      pOVar1 = B + this_m._4_4_;
      x = pOVar1->x;
      t.x = pOVar1->y;
      t.y = pOVar1->z;
      pOVar2 = B + rank;
      pOVar1 = B + this_m._4_4_;
      pOVar1->x = pOVar2->x;
      pOVar1->y = pOVar2->y;
      pOVar1->z = pOVar2->z;
      pOVar1 = B + rank;
      pOVar1->x = x;
      pOVar1->y = t.x;
      pOVar1->z = t.y;
    }
    piv = 1.0 / ppdStack_68[rank][rank];
    ppdStack_68[rank][rank] = 1.0;
    ON_ArrayScale((this->m_col_count + -1) - rank,piv,ppdStack_68[rank] + (rank + 1),
                  ppdStack_68[rank] + (rank + 1));
    ON_3dPoint::operator*=(B + rank,piv);
    ix = rank;
    while (ix = ix + 1, ix < this->m_row_count) {
      piv = -ppdStack_68[ix][rank];
      ppdStack_68[ix][rank] = 0.0;
      if (zero_tolerance < ABS(piv)) {
        ON_Array_aA_plus_B((this->m_col_count + -1) - rank,piv,ppdStack_68[rank] + (rank + 1),
                           ppdStack_68[ix] + (rank + 1),ppdStack_68[ix] + (rank + 1));
        ::operator*(&local_a0,piv,B + rank);
        ON_3dVector::ON_3dVector(&local_88,&local_a0);
        ON_3dPoint::operator+=(B + ix,&local_88);
      }
    }
  }
  if (t.z != 0.0) {
    *(double *)t.z = _k;
  }
  return (int)this_m;
}

Assistant:

int
ON_Matrix::RowReduce( 
    double zero_tolerance,
    ON_3dPoint* B,
    double* pivot 
    )
{
  ON_3dPoint t;
  double x, piv;
  int i, k, ix, rank;

  double** this_m = ThisM();
  piv = 0.0;
  rank = 0;
  const int n = m_row_count <= m_col_count ? m_row_count : m_col_count;
  for ( k = 0; k < n; k++ ) {
    //onfree( onmalloc( 1)); // 8-06-03 lw for cancel thread responsiveness
    onmalloc( 0); // 9-4-03 lw changed to 0
    ix = k;
    x = fabs(this_m[ix][k]);
    for ( i = k+1; i < m_row_count; i++ ) {
      if ( fabs(this_m[i][k]) > x ) {
        ix = i;
        x = fabs(this_m[ix][k]);
      }
    }
    if ( x < piv || k == 0 ) {
      piv = x;
    }
    if ( x <= zero_tolerance )
      break;
    rank++;

    if ( ix != k )
    {
      // swap rows of matrix and B
      SwapRows( ix, k );
      t = B[ix]; B[ix] = B[k]; B[k] = t;
    }

    // scale row k of matrix and B
    x = 1.0/this_m[k][k];
    this_m[k][k] = 1.0;
    ON_ArrayScale( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[k][k+1] );
    B[k] *= x;

    // zero column k for rows below this_m[k][k]
    for ( i = k+1; i < m_row_count; i++ ) {
      x = -this_m[i][k];
      this_m[i][k] = 0.0;
      if ( fabs(x) > zero_tolerance ) {
        ON_Array_aA_plus_B( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[i][k+1], &this_m[i][k+1] );
        B[i] += x*B[k];
      }
    }
  }

  if ( pivot )
    *pivot = piv;

  return rank;
}